

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O3

void re2::SearchRE2(int iters,char *regexp,StringPiece *text,Anchor anchor,bool expect_match)

{
  bool bVar1;
  int iVar2;
  RE2 re;
  char *local_290;
  int local_288 [94];
  RE2 local_110;
  
  if (0 < iters) {
    do {
      RE2::RE2(&local_110,regexp);
      iVar2 = std::__cxx11::string::compare((char *)local_110.error_);
      if (iVar2 != 0) {
        LogMessage::LogMessage
                  ((LogMessage *)&local_290,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                   ,0x3b7,3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_288,"Check failed: (re.error()) == (\"\")",0x22);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_290);
      }
      local_290 = text->ptr_;
      local_288[0] = text->length_;
      if (anchor == kAnchored) {
        bVar1 = RE2::FullMatchN((StringPiece *)&local_290,&local_110,(Arg **)0x0,0);
        if (bVar1 != expect_match) {
          LogMessage::LogMessage
                    ((LogMessage *)&local_290,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                     ,0x3b9,3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_288,
                     "Check failed: (RE2::FullMatch(text, re)) == (expect_match)",0x3a);
LAB_00121f8e:
          LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_290);
        }
      }
      else {
        bVar1 = RE2::PartialMatchN((StringPiece *)&local_290,&local_110,(Arg **)0x0,0);
        if (bVar1 != expect_match) {
          LogMessage::LogMessage
                    ((LogMessage *)&local_290,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                     ,0x3bb,3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_288,
                     "Check failed: (RE2::PartialMatch(text, re)) == (expect_match)",0x3d);
          goto LAB_00121f8e;
        }
      }
      RE2::~RE2(&local_110);
      iters = iters + -1;
    } while (iters != 0);
  }
  return;
}

Assistant:

void SearchRE2(int iters, const char* regexp, const StringPiece& text,
               Prog::Anchor anchor, bool expect_match) {
  for (int i = 0; i < iters; i++) {
    RE2 re(regexp);
    CHECK_EQ(re.error(), "");
    if (anchor == Prog::kAnchored)
      CHECK_EQ(RE2::FullMatch(text, re), expect_match);
    else
      CHECK_EQ(RE2::PartialMatch(text, re), expect_match);
  }
}